

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::~BBoxRenderCase(BBoxRenderCase *this)

{
  code *pcVar1;
  BBoxRenderCase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

BBoxRenderCase::~BBoxRenderCase (void)
{
	deinit();
}